

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O3

uint32_t __thiscall MPEGRawDataHeader::serialize(MPEGRawDataHeader *this,uint8_t *buffer)

{
  memcpy(buffer,this->m_data_buffer,(long)this->m_data_buffer_len);
  return this->m_data_buffer_len;
}

Assistant:

uint32_t MPEGRawDataHeader::serialize(uint8_t* buffer)
{
    if (!m_headerIncludedToBuff)
    {
        // buffer does not include pictureHeader. we're serializing it.
        // todo not implemented. this branch is currently never entered.
    }
    // the buffer includes everything - the pictureHeader as well
    memcpy(buffer, m_data_buffer, m_data_buffer_len);

    return m_data_buffer_len;
}